

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_ptr.hpp
# Opt level: O1

exception_ptr
boost::exception_detail::get_static_exception_object<boost::exception_detail::bad_alloc_>(void)

{
  atomic_int_least32_t *paVar1;
  char cVar2;
  int iVar3;
  clone_impl<boost::exception_detail::bad_alloc_> *p;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar4;
  element_type *in_RDI;
  exception_ptr eVar5;
  clone_impl<boost::exception_detail::bad_alloc_> c;
  bad_alloc_ ba;
  clone_impl<boost::exception_detail::bad_alloc_> local_98;
  undefined1 local_60 [48];
  element_type *local_30;
  shared_count local_28;
  
  local_60._8_8_ = (error_info_container *)0x0;
  local_60._16_8_ = (char *)0x0;
  local_60._24_8_ = (char *)0x0;
  local_60._32_4_ = -1;
  local_60._0_8_ = &PTR__bad_alloc__00126358;
  local_60._40_8_ = &PTR__bad_alloc__00126378;
  clone_impl<boost::exception_detail::bad_alloc_>::clone_impl(&local_98,(bad_alloc_ *)local_60);
  local_98.super_bad_alloc_.super_exception.throw_function_ =
       "exception_ptr boost::exception_detail::get_static_exception_object() [Exception = boost::exception_detail::bad_alloc_]"
  ;
  local_98.super_bad_alloc_.super_exception.throw_file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/exception/detail/exception_ptr.hpp"
  ;
  local_98.super_bad_alloc_.super_exception.throw_line_ = 0x81;
  if ((get_static_exception_object<boost::exception_detail::bad_alloc_>()::ep == '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_static_exception_object<boost::exception_detail::bad_alloc_>()
                                   ::ep), iVar3 != 0)) {
    p = (clone_impl<boost::exception_detail::bad_alloc_> *)operator_new(0x38);
    *(undefined ***)&p->field_0x30 = &PTR___cxa_pure_virtual_00125e78;
    (p->super_bad_alloc_).super_exception._vptr_exception =
         (_func_int **)&PTR___cxa_pure_virtual_00125ef0;
    (p->super_bad_alloc_).super_exception.data_.px_ =
         local_98.super_bad_alloc_.super_exception.data_.px_;
    if (local_98.super_bad_alloc_.super_exception.data_.px_ != (error_info_container *)0x0) {
      (**(code **)(*(long *)local_98.super_bad_alloc_.super_exception.data_.px_ + 0x18))();
    }
    (p->super_bad_alloc_).super_exception.throw_line_ =
         local_98.super_bad_alloc_.super_exception.throw_line_;
    (p->super_bad_alloc_).super_exception.throw_function_ =
         local_98.super_bad_alloc_.super_exception.throw_function_;
    (p->super_bad_alloc_).super_exception.throw_file_ =
         local_98.super_bad_alloc_.super_exception.throw_file_;
    (p->super_bad_alloc_).super_exception._vptr_exception = (_func_int **)0x1263e0;
    *(undefined8 *)&(p->super_bad_alloc_).super_bad_alloc = 0x126410;
    *(undefined8 *)&p->field_0x30 = 0x126450;
    shared_ptr<boost::exception_detail::clone_base_const>::
    shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>>
              ((shared_ptr<boost::exception_detail::clone_base_const> *)&local_30,p);
    get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.px = local_30;
    get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.pn.pi_ = local_28.pi_;
    if (local_28.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_28.pi_)->use_count_ = (local_28.pi_)->use_count_ + 1;
      UNLOCK();
    }
    detail::shared_count::~shared_count(&local_28);
    __cxa_atexit(exception_ptr::~exception_ptr,
                 &get_static_exception_object<boost::exception_detail::bad_alloc_>::ep,&__dso_handle
                );
    __cxa_guard_release(&get_static_exception_object<boost::exception_detail::bad_alloc_>()::ep);
  }
  in_RDI->_vptr_clone_base =
       (_func_int **)get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.px;
  sVar4 = get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.pn;
  in_RDI[1]._vptr_clone_base =
       (_func_int **)
       get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.pn.pi_;
  if (sVar4.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    paVar1 = &(sVar4.pi_)->use_count_;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
  }
  std::bad_alloc::~bad_alloc(&local_98.super_bad_alloc_.super_bad_alloc);
  local_98.super_bad_alloc_.super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_00125ef0;
  if ((local_98.super_bad_alloc_.super_exception.data_.px_ != (error_info_container *)0x0) &&
     (cVar2 = (**(code **)(*(long *)local_98.super_bad_alloc_.super_exception.data_.px_ + 0x20))(),
     cVar2 != '\0')) {
    local_98.super_bad_alloc_.super_exception.data_.px_ = (error_info_container *)0x0;
  }
  std::bad_alloc::~bad_alloc((bad_alloc *)(local_60 + 0x28));
  local_60._0_8_ = &PTR___cxa_pure_virtual_00125ef0;
  sVar4.pi_ = extraout_RDX;
  if ((error_info_container *)local_60._8_8_ != (error_info_container *)0x0) {
    (**(code **)(*(long *)local_60._8_8_ + 0x20))();
    sVar4.pi_ = extraout_RDX_00;
  }
  eVar5.ptr_.pn.pi_ = sVar4.pi_;
  eVar5.ptr_.px = in_RDI;
  return (exception_ptr)eVar5.ptr_;
}

Assistant:

exception_ptr
        get_static_exception_object()
            {
            Exception ba;
            exception_detail::clone_impl<Exception> c(ba);
#ifndef BOOST_EXCEPTION_DISABLE
            c <<
                throw_function(BOOST_CURRENT_FUNCTION) <<
                throw_file(__FILE__) <<
                throw_line(__LINE__);
#endif
            static exception_ptr ep(shared_ptr<exception_detail::clone_base const>(new exception_detail::clone_impl<Exception>(c)));
            return ep;
            }